

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpRelaxation.cpp
# Opt level: O2

double __thiscall
HighsLpRelaxation::computeLPDegneracy(HighsLpRelaxation *this,HighsDomain *localdomain)

{
  double *pdVar1;
  uint uVar2;
  uint uVar3;
  pointer pHVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  
  dVar13 = 1.0;
  if (((this->lpsolver).solution_.dual_valid == true) && ((this->lpsolver).basis_.valid == true)) {
    dVar13 = (this->lpsolver).info_.super_HighsInfoStruct.max_dual_infeasibility;
    uVar2 = (this->lpsolver).model_.lp_.num_row_;
    pHVar4 = (this->lpsolver).basis_.row_status.
             super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar11 = 0;
    uVar12 = 0;
    if (0 < (int)uVar2) {
      uVar12 = (ulong)uVar2;
    }
    iVar9 = 0;
    iVar5 = 0;
    iVar6 = 0;
    for (; uVar12 != uVar11; uVar11 = uVar11 + 1) {
      dVar14 = (this->lpsolver).model_.lp_.row_lower_.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[uVar11];
      pdVar1 = (this->lpsolver).model_.lp_.row_upper_.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start + uVar11;
      if ((dVar14 != *pdVar1) || (NAN(dVar14) || NAN(*pdVar1))) {
        iVar5 = iVar5 + 1;
        if ((pHVar4[uVar11] != kBasic) &&
           (dVar13 < ABS((this->lpsolver).solution_.row_dual.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar11]))) {
          iVar6 = iVar6 + 1;
        }
      }
      else {
        iVar9 = iVar9 + (uint)(pHVar4[uVar11] == kBasic);
      }
    }
    uVar3 = (this->lpsolver).model_.lp_.num_col_;
    uVar12 = 0;
    uVar11 = 0;
    if (0 < (int)uVar3) {
      uVar11 = (ulong)uVar3;
    }
    iVar8 = 0;
    iVar7 = 0;
    for (; uVar11 != uVar12; uVar12 = uVar12 + 1) {
      if ((this->lpsolver).basis_.col_status.
          super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
          super__Vector_impl_data._M_start[uVar12] != kBasic) {
        if (ABS((this->lpsolver).solution_.col_dual.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start[uVar12]) <= dVar13) {
          dVar14 = (localdomain->col_lower_).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar12];
          pdVar1 = (localdomain->col_upper_).super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start + uVar12;
          if ((dVar14 == *pdVar1) && (!NAN(dVar14) && !NAN(*pdVar1))) {
            iVar8 = iVar8 + 1;
          }
        }
        else {
          iVar7 = iVar7 + 1;
        }
      }
    }
    iVar10 = (((iVar5 + iVar9) - uVar2) - iVar8) + uVar3;
    if (iVar10 < 1) {
      dVar14 = 0.0;
    }
    else {
      dVar14 = 1.0 - (double)(iVar7 + iVar6) / (double)iVar10;
    }
    dVar13 = 1.0;
    dVar15 = 1.0;
    if (0 < (int)uVar2) {
      dVar15 = (double)(int)(((iVar5 + iVar9) - (iVar6 + iVar8 + iVar7)) + uVar3) /
               (double)(int)uVar2;
    }
    if (0.8 <= dVar14) {
      dVar13 = pow(10.0,(dVar14 + -0.7) * 10.0);
    }
    dVar13 = (double)(~-(ulong)(dVar15 < 2.0) & (ulong)(dVar15 * 10.0) |
                     -(ulong)(dVar15 < 2.0) & 0x3ff0000000000000) * dVar13;
  }
  return dVar13;
}

Assistant:

double HighsLpRelaxation::computeLPDegneracy(
    const HighsDomain& localdomain) const {
  if (!lpsolver.getSolution().dual_valid || !lpsolver.getBasis().valid) {
    return 1.0;
  }

  double dualFeasTol = lpsolver.getInfo().max_dual_infeasibility;

  const HighsBasis& basis = lpsolver.getBasis();
  const HighsSolution& sol = lpsolver.getSolution();

  HighsInt numFixedRows = 0;
  HighsInt numInequalities = 0;
  HighsInt numBasicEqualities = 0;

  for (HighsInt i = 0; i < numRows(); ++i) {
    if (lpsolver.getLp().row_lower_[i] != lpsolver.getLp().row_upper_[i]) {
      ++numInequalities;

      if (basis.row_status[i] != HighsBasisStatus::kBasic) {
        if (std::abs(sol.row_dual[i]) > dualFeasTol) ++numFixedRows;
      }
    } else
      numBasicEqualities += basis.row_status[i] == HighsBasisStatus::kBasic;
  }

  HighsInt numAlreadyFixedCols = 0;
  HighsInt numFixedCols = 0;
  for (HighsInt i = 0; i < numCols(); ++i) {
    if (basis.col_status[i] != HighsBasisStatus::kBasic) {
      if (std::abs(sol.col_dual[i]) > dualFeasTol)
        ++numFixedCols;
      else if (localdomain.col_lower_[i] == localdomain.col_upper_[i])
        ++numAlreadyFixedCols;
    }
  }

  HighsInt base = numCols() - numAlreadyFixedCols + numInequalities +
                  numBasicEqualities - numRows();

  double degenerateColumnShare =
      base > 0 ? 1.0 - double(numFixedCols + numFixedRows) / base : 0.0;

  double varConsRatio =
      numRows() > 0
          ? double(numCols() + numInequalities + numBasicEqualities -
                   numFixedCols - numFixedRows - numAlreadyFixedCols) /
                numRows()
          : 1.0;
  double fac1 = degenerateColumnShare < 0.8
                    ? 1.0
                    : std::pow(10.0, 10 * (degenerateColumnShare - 0.7));
  double fac2 = varConsRatio < 2.0 ? 1.0 : 10.0 * varConsRatio;

  return fac1 * fac2;
}